

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcessing.cpp
# Opt level: O0

void mergeRelatedLines(vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_> *lines,
                      Mat *img)

{
  float fVar1;
  float fVar2;
  int iVar3;
  bool bVar4;
  reference pVVar5;
  float *pfVar6;
  reference b;
  double dVar7;
  double dVar8;
  MatSize local_98 [4];
  int local_94;
  int local_90 [2];
  Point_<int> local_88;
  Point pt2;
  Point pt1;
  float theta;
  float p;
  Vec<float,_2> *local_68;
  __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
  local_60;
  iterator pos;
  int local_50 [2];
  Point_<int> local_48;
  Point pt2current;
  Point pt1current;
  float theta1;
  float p1;
  Vec<float,_2> *local_28;
  __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
  local_20;
  iterator current;
  Mat *img_local;
  vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_> *lines_local;
  
  current._M_current = (Vec<float,_2> *)img;
  __gnu_cxx::
  __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
  ::__normal_iterator(&local_20);
  local_28 = (Vec<float,_2> *)
             std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>::begin(lines);
  local_20._M_current = local_28;
  do {
    _theta1 = std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>::end(lines);
    bVar4 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                        *)&theta1);
    if (!bVar4) {
      return;
    }
    pVVar5 = __gnu_cxx::
             __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
             ::operator*(&local_20);
    pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,0);
    if ((*pfVar6 != 0.0) || (NAN(*pfVar6))) {
LAB_0011e1f3:
      pVVar5 = __gnu_cxx::
               __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
               ::operator*(&local_20);
      pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,0);
      fVar1 = *pfVar6;
      pVVar5 = __gnu_cxx::
               __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
               ::operator*(&local_20);
      pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,1);
      fVar2 = *pfVar6;
      cv::Point_<int>::Point_(&pt2current);
      cv::Point_<int>::Point_(&local_48);
      if ((fVar2 <= 0.7853982) || (2.3561945 <= fVar2)) {
        pt2current.y = 0;
        dVar7 = std::cos((double)(ulong)(uint)fVar2);
        pt2current.x = (int)(fVar1 / SUB84(dVar7,0));
        cv::MatSize::operator()((MatSize *)&pos);
        local_48.y = pos._M_current._4_4_;
        iVar3 = -pos._M_current._4_4_;
        dVar7 = std::tan((double)(ulong)(uint)fVar2);
        dVar8 = std::cos((double)(ulong)(uint)fVar2);
        local_48.x = (int)((float)iVar3 / SUB84(dVar7,0) + fVar1 / SUB84(dVar8,0));
      }
      else {
        pt2current.x = 0;
        dVar7 = std::sin((double)(ulong)(uint)fVar2);
        pt2current.y = (int)(fVar1 / SUB84(dVar7,0));
        cv::MatSize::operator()((MatSize *)local_50);
        local_48.x = local_50[0];
        iVar3 = -local_50[0];
        dVar7 = std::tan((double)(ulong)(uint)fVar2);
        dVar8 = std::sin((double)(ulong)(uint)fVar2);
        local_48.y = (int)((float)iVar3 / SUB84(dVar7,0) + fVar1 / SUB84(dVar8,0));
      }
      __gnu_cxx::
      __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
      ::__normal_iterator(&local_60);
      local_68 = (Vec<float,_2> *)
                 std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>::begin(lines);
      local_60._M_current = local_68;
      while( true ) {
        _theta = std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>::end(lines);
        bVar4 = __gnu_cxx::operator!=
                          (&local_60,
                           (__normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                            *)&theta);
        if (!bVar4) break;
        pVVar5 = __gnu_cxx::
                 __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                 ::operator*(&local_20);
        b = __gnu_cxx::
            __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
            ::operator*(&local_60);
        bVar4 = cv::operator==(&pVVar5->super_Matx<float,_2,_1>,&b->super_Matx<float,_2,_1>);
        if (!bVar4) {
          pVVar5 = __gnu_cxx::
                   __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                   ::operator*(&local_60);
          pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,0);
          fVar1 = *pfVar6;
          pVVar5 = __gnu_cxx::
                   __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                   ::operator*(&local_20);
          pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,0);
          dVar7 = std::fabs((double)(ulong)(uint)(fVar1 - *pfVar6));
          if (SUB84(dVar7,0) < 20.0) {
            pVVar5 = __gnu_cxx::
                     __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                     ::operator*(&local_60);
            pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,1);
            fVar1 = *pfVar6;
            pVVar5 = __gnu_cxx::
                     __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                     ::operator*(&local_20);
            pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,1);
            dVar7 = std::fabs((double)(ulong)(uint)(fVar1 - *pfVar6));
            if (SUB84(dVar7,0) < 0.17453292) {
              pVVar5 = __gnu_cxx::
                       __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                       ::operator*(&local_60);
              pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,0);
              fVar1 = *pfVar6;
              pVVar5 = __gnu_cxx::
                       __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                       ::operator*(&local_60);
              pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,1);
              fVar2 = *pfVar6;
              cv::Point_<int>::Point_(&pt2);
              cv::Point_<int>::Point_(&local_88);
              pVVar5 = __gnu_cxx::
                       __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                       ::operator*(&local_60);
              pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,1);
              if (*pfVar6 <= 0.7853982) {
LAB_0011e67f:
                pt2.y = 0;
                dVar7 = std::cos((double)(ulong)(uint)fVar2);
                pt2.x = (int)(fVar1 / SUB84(dVar7,0));
                cv::MatSize::operator()(local_98);
                local_88.y = local_94;
                iVar3 = -local_94;
                dVar7 = std::tan((double)(ulong)(uint)fVar2);
                dVar8 = std::cos((double)(ulong)(uint)fVar2);
                local_88.x = (int)((float)iVar3 / SUB84(dVar7,0) + fVar1 / SUB84(dVar8,0));
              }
              else {
                pVVar5 = __gnu_cxx::
                         __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                         ::operator*(&local_60);
                pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,1);
                if (2.3561945 <= *pfVar6) goto LAB_0011e67f;
                pt2.x = 0;
                dVar7 = std::sin((double)(ulong)(uint)fVar2);
                pt2.y = (int)(fVar1 / SUB84(dVar7,0));
                cv::MatSize::operator()((MatSize *)local_90);
                local_88.x = local_90[0];
                iVar3 = -local_90[0];
                dVar7 = std::tan((double)(ulong)(uint)fVar2);
                dVar8 = std::sin((double)(ulong)(uint)fVar2);
                local_88.y = (int)((float)iVar3 / SUB84(dVar7,0) + fVar1 / SUB84(dVar8,0));
              }
              if (((double)(pt2.x - pt2current.x) * (double)(pt2.x - pt2current.x) +
                   (double)((pt2.y - pt2current.y) * (pt2.y - pt2current.y)) < 4096.0) &&
                 ((double)(local_88.x - local_48.x) * (double)(local_88.x - local_48.x) +
                  (double)((local_88.y - local_48.y) * (local_88.y - local_48.y)) < 4096.0)) {
                pVVar5 = __gnu_cxx::
                         __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                         ::operator*(&local_20);
                pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,0);
                fVar1 = *pfVar6;
                pVVar5 = __gnu_cxx::
                         __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                         ::operator*(&local_60);
                pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,0);
                fVar2 = *pfVar6;
                pVVar5 = __gnu_cxx::
                         __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                         ::operator*(&local_20);
                pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,0);
                *pfVar6 = (fVar1 + fVar2) / 2.0;
                pVVar5 = __gnu_cxx::
                         __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                         ::operator*(&local_20);
                pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,1);
                fVar1 = *pfVar6;
                pVVar5 = __gnu_cxx::
                         __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                         ::operator*(&local_60);
                pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,1);
                fVar2 = *pfVar6;
                pVVar5 = __gnu_cxx::
                         __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                         ::operator*(&local_20);
                pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,1);
                *pfVar6 = (fVar1 + fVar2) / 2.0;
                pVVar5 = __gnu_cxx::
                         __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                         ::operator*(&local_60);
                pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,0);
                *pfVar6 = 0.0;
                pVVar5 = __gnu_cxx::
                         __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
                         ::operator*(&local_60);
                pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,1);
                *pfVar6 = -100.0;
              }
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
        ::operator++(&local_60,0);
      }
    }
    else {
      pVVar5 = __gnu_cxx::
               __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
               ::operator*(&local_20);
      pfVar6 = cv::Vec<float,_2>::operator[](pVVar5,1);
      if ((*pfVar6 != -100.0) || (NAN(*pfVar6))) goto LAB_0011e1f3;
    }
    __gnu_cxx::
    __normal_iterator<cv::Vec<float,_2>_*,_std::vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>_>
    ::operator++(&local_20,0);
  } while( true );
}

Assistant:

void mergeRelatedLines(vector<Vec2f> *lines, Mat &img){
    vector<Vec2f>::iterator current;
    for(current=lines->begin();current!=lines->end();current++){
        if((*current)[0]==0 && (*current)[1]==-100) continue;
        float p1 = (*current)[0];
        float theta1 = (*current)[1];
        Point pt1current, pt2current;
        if(theta1>CV_PI*45/180 && theta1<CV_PI*135/180){
            pt1current.x=0;

            pt1current.y = p1/sin(theta1);

            pt2current.x=img.size().width;
            pt2current.y=-pt2current.x/tan(theta1) + p1/sin(theta1);
        }
        else{
            pt1current.y=0;

            pt1current.x=p1/cos(theta1);

            pt2current.y=img.size().height;
            pt2current.x=-pt2current.y/tan(theta1) + p1/cos(theta1);

        }
        vector<Vec2f>::iterator    pos;
        for(pos=lines->begin();pos!=lines->end();pos++){
            if(*current==*pos) continue;
            if(fabs((*pos)[0]-(*current)[0])<20 && fabs((*pos)[1]-(*current)[1])<CV_PI*10/180){
                float p = (*pos)[0];
                float theta = (*pos)[1];
                Point pt1, pt2;
                if((*pos)[1]>CV_PI*45/180 && (*pos)[1]<CV_PI*135/180){
                    pt1.x=0;
                    pt1.y = p/sin(theta);
                    pt2.x=img.size().width;
                    pt2.y=-pt2.x/tan(theta) + p/sin(theta);
                }
                else{
                    pt1.y=0;
                    pt1.x=p/cos(theta);
                    pt2.y=img.size().height;
                    pt2.x=-pt2.y/tan(theta) + p/cos(theta);
                }
                if(((double)(pt1.x-pt1current.x)*(pt1.x-pt1current.x) + (pt1.y-pt1current.y)*(pt1.y-pt1current.y)<64*64) &&
                    ((double)(pt2.x-pt2current.x)*(pt2.x-pt2current.x) + (pt2.y-pt2current.y)*(pt2.y-pt2current.y)<64*64))
                {
                    // Merge the two
                    (*current)[0] = ((*current)[0]+(*pos)[0])/2;

                    (*current)[1] = ((*current)[1]+(*pos)[1])/2;

                    (*pos)[0]=0;
                    (*pos)[1]=-100;
                }
            }
        }
    }
}